

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_DebugStringRoundTripVisibility_Test::
~FileDescriptorTest_DebugStringRoundTripVisibility_Test
          (FileDescriptorTest_DebugStringRoundTripVisibility_Test *this)

{
  (this->super_FileDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FileDescriptorTest_018dfd28;
  DescriptorPool::~DescriptorPool(&(this->super_FileDescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, DebugStringRoundTripVisibility) {
  DescriptorPool pool;

  // warning load-bearing whitespace below.  This tests the round-trip of
  // content string -> Parse -> Descriptor -> DebugString and asserts the input
  // content is identical to the output debugstring (white-space included).
  absl::string_view content = R"schema(edition = "2024";

package ed2024.visibility.unittest;

local message VisibilityLocalMessage {
  local message NestedLocalMessage {
    local message InnerNestedLocalMessage {
    }
  }
  export message NestedExportMessage {
    export message InnerNestedExportMessage {
    }
  }
  local enum NestedLocalEnum {
    YES = 0;
  }
  export enum NestedExportEnum {
    NO = 0;
  }
}

export message VisibilityExportMessage {
  local message NestedLocalMessage {
    local message InnerNestedLocalMessage {
    }
  }
  export message NestedExportMessage {
    export message InnerNestedExportMessage {
    }
  }
  local enum NestedLocalEnum {
    UP = 0;
  }
  export enum NestedExportEnum {
    DOWN = 0;
  }
}

)schema";

  io::ArrayInputStream input_stream(content.data(), content.size());
  SimpleErrorCollector error_collector;
  io::Tokenizer tokenizer(&input_stream, &error_collector);
  compiler::Parser parser;
  parser.RecordErrorsTo(&error_collector);
  FileDescriptorProto proto;
  ASSERT_TRUE(parser.Parse(&tokenizer, &proto))
      << error_collector.last_error() << "\n"
      << content;
  ASSERT_EQ("", error_collector.last_error());
  proto.set_name("google/protobuf/unittest_visibility_edition_2024.proto");
  const FileDescriptor* descriptor = pool.BuildFile(proto);
  ASSERT_TRUE(descriptor != nullptr) << error_collector.last_error();
  EXPECT_EQ(content, descriptor->DebugString());
}